

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int __thiscall SQLite::Statement::getColumnIndex(Statement *this,char *apName)

{
  mapped_type mVar1;
  bool bVar2;
  sqlite3_stmt *pStmt;
  char *pcVar3;
  mapped_type *pmVar4;
  Exception *this_00;
  pointer ppVar5;
  long in_FS_OFFSET;
  _Self local_a0;
  allocator<char> local_91;
  _Self local_90;
  iterator iIndex;
  allocator<char> local_71;
  char *local_70;
  char *pName;
  char *pcStack_60;
  int i;
  char *apName_local;
  Statement *this_local;
  key_type local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pcStack_60 = apName;
  apName_local = (char *)this;
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::empty(&this->mColumnNames);
  if (bVar2) {
    for (pName._4_4_ = 0; pName._4_4_ < this->mColumnCount; pName._4_4_ = pName._4_4_ + 1) {
      pStmt = getPreparedStatement(this);
      pcVar3 = sqlite3_column_name(pStmt,pName._4_4_);
      mVar1 = pName._4_4_;
      local_70 = pcVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,pcVar3,&local_71);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->mColumnNames,&local_30);
      *pmVar4 = mVar1;
      std::__cxx11::string::~string((string *)&local_30);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  pcVar3 = pcStack_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this_local,pcVar3,&local_91);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->mColumnNames,(key_type *)&this_local);
  std::__cxx11::string::~string((string *)&this_local);
  std::allocator<char>::~allocator(&local_91);
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->mColumnNames);
  bVar2 = std::operator==(&local_90,&local_a0);
  if (bVar2) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,"Unknown column name.");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_90);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return ppVar5->second;
    }
  }
  __stack_chk_fail();
}

Assistant:

int Statement::getColumnIndex(const char* apName) const
{
    // Build the map of column index by name on first call
    if (mColumnNames.empty())
    {
        for (int i = 0; i < mColumnCount; ++i)
        {
            const char* pName = sqlite3_column_name(getPreparedStatement(), i);
            mColumnNames[pName] = i;
        }
    }

    const auto iIndex = mColumnNames.find(apName);
    if (iIndex == mColumnNames.end())
    {
        throw SQLite::Exception("Unknown column name.");
    }

    return iIndex->second;
}